

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.h
# Opt level: O1

void __thiscall
miniros::Subscription::PendingConnection::~PendingConnection(PendingConnection *this)

{
  ~PendingConnection(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

~PendingConnection()
      {
        delete client_;
      }